

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamZ.cpp
# Opt level: O0

void __thiscall OpenMD::TetrahedralityParamZ::process(TetrahedralityParamZ *this)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  SnapshotManager *this_00;
  Snapshot *pSVar8;
  double *pdVar9;
  size_type sVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  long in_RDI;
  __type _Var14;
  int binNo;
  int j;
  int i;
  int nang;
  int nbors;
  RealType halfBoxZ_;
  Mat3x3d hmat;
  int istep;
  int nFrames;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  int isd2;
  int isd1;
  vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  myNeighbors;
  RealType Qk;
  RealType cospsi;
  RealType r;
  Vector3d rkj;
  Vector3d rik;
  Vector3d rk;
  Vector3d rj;
  Vector3d ri;
  Vector3d vec;
  int myIndex;
  StuntDouble *sdj;
  StuntDouble *sdi;
  StuntDouble *sd2;
  StuntDouble *sd;
  Snapshot *in_stack_ffffffffffffea08;
  DumpReader *in_stack_ffffffffffffea10;
  __normal_iterator<std::pair<double,_OpenMD::StuntDouble_*>_*,_std::vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>_>
  in_stack_ffffffffffffea18;
  __normal_iterator<std::pair<double,_OpenMD::StuntDouble_*>_*,_std::vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>_>
  in_stack_ffffffffffffea20;
  SelectionEvaluator *in_stack_ffffffffffffea48;
  int local_15a0;
  Vector3d *in_stack_ffffffffffffea88;
  undefined4 in_stack_ffffffffffffea90;
  int in_stack_ffffffffffffea94;
  StuntDouble *in_stack_ffffffffffffea98;
  undefined4 in_stack_ffffffffffffeaa0;
  int in_stack_ffffffffffffeaa4;
  int local_14b4;
  int local_147c;
  string *in_stack_ffffffffffffec60;
  SimInfo *in_stack_ffffffffffffec68;
  DumpReader *in_stack_ffffffffffffec70;
  int local_1370;
  TetrahedralityParamZ *in_stack_ffffffffffffed40;
  vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  local_f0;
  DumpReader *local_d8;
  double local_d0;
  Vector3d *local_c8;
  Vector<double,_3U> local_90 [4];
  int local_2c;
  StuntDouble *local_28;
  StuntDouble *local_20;
  StuntDouble *local_18;
  Snapshot *local_10;
  
  Vector3<double>::Vector3((Vector3<double> *)0x1e3f9c);
  Vector3<double>::Vector3((Vector3<double> *)0x1e3fa9);
  Vector3<double>::Vector3((Vector3<double> *)0x1e3fb6);
  Vector3<double>::Vector3((Vector3<double> *)0x1e3fc3);
  Vector3<double>::Vector3((Vector3<double> *)0x1e3fd0);
  Vector3<double>::Vector3((Vector3<double> *)0x1e3fdd);
  std::
  vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  ::vector((vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
            *)0x1e3fea);
  SimInfo::getSimParams(*(SimInfo **)(in_RDI + 8));
  bVar4 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x1e4012);
  DumpReader::DumpReader
            (in_stack_ffffffffffffec70,in_stack_ffffffffffffec68,in_stack_ffffffffffffec60);
  iVar6 = DumpReader::getNFrames(in_stack_ffffffffffffea10);
  for (local_1370 = 0; local_1370 < iVar6; local_1370 = *(int *)(in_RDI + 0x30) + local_1370) {
    DumpReader::readFrame
              ((DumpReader *)CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
               (int)((ulong)in_stack_ffffffffffffea98 >> 0x20));
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
    pSVar8 = SnapshotManager::getCurrentSnapshot(this_00);
    *(Snapshot **)(in_RDI + 200) = pSVar8;
    Snapshot::getHmat(in_stack_ffffffffffffea08);
    RectMatrix<double,_3U,_3U>::operator()
              ((RectMatrix<double,_3U,_3U> *)&stack0xffffffffffffec48,*(uint *)(in_RDI + 0xdb0),
               *(uint *)(in_RDI + 0xdb0));
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea20._M_current,
               &(in_stack_ffffffffffffea18._M_current)->first);
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)&stack0xffffffffffffec48,
                        *(uint *)(in_RDI + 0xdb0),*(uint *)(in_RDI + 0xdb0));
    dVar1 = *pdVar9;
    bVar5 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x2a0));
    if (bVar5) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffea48);
      SelectionManager::setSelectionSet
                ((SelectionManager *)in_stack_ffffffffffffea20._M_current,
                 (SelectionSet *)in_stack_ffffffffffffea18._M_current);
      SelectionSet::~SelectionSet((SelectionSet *)0x1e421a);
    }
    bVar5 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x7f0));
    if (bVar5) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffea48);
      SelectionManager::setSelectionSet
                ((SelectionManager *)in_stack_ffffffffffffea20._M_current,
                 (SelectionSet *)in_stack_ffffffffffffea18._M_current);
      SelectionSet::~SelectionSet((SelectionSet *)0x1e430a);
    }
    local_10 = (Snapshot *)
               SelectionManager::beginSelected
                         ((SelectionManager *)in_stack_ffffffffffffea20._M_current,
                          (int *)in_stack_ffffffffffffea18._M_current);
    while (local_10 != (Snapshot *)0x0) {
      in_stack_ffffffffffffeaa4 = StuntDouble::getGlobalIndex((StuntDouble *)local_10);
      local_d8 = (DumpReader *)0x3ff0000000000000;
      local_2c = in_stack_ffffffffffffeaa4;
      std::
      vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
      ::clear((vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
               *)0x1e43ba);
      in_stack_ffffffffffffea98 =
           SelectionManager::beginSelected
                     ((SelectionManager *)in_stack_ffffffffffffea20._M_current,
                      (int *)in_stack_ffffffffffffea18._M_current);
      local_18 = in_stack_ffffffffffffea98;
      while (local_18 != (StuntDouble *)0x0) {
        in_stack_ffffffffffffea94 = StuntDouble::getGlobalIndex(local_18);
        if (in_stack_ffffffffffffea94 != local_2c) {
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea18._M_current);
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea18._M_current);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffea18._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffea10);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffea18._M_current,
                     (Vector<double,_3U> *)in_stack_ffffffffffffea10);
          if (bVar4) {
            Snapshot::wrapVector
                      ((Snapshot *)CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90),
                       in_stack_ffffffffffffea88);
          }
          in_stack_ffffffffffffea88 =
               (Vector3d *)Vector<double,_3U>::length((Vector<double,_3U> *)0x1e44c4);
          local_c8 = in_stack_ffffffffffffea88;
          if ((double)in_stack_ffffffffffffea88 < *(double *)(in_RDI + 0xd40)) {
            std::make_pair<double&,OpenMD::StuntDouble*&>
                      ((double *)in_stack_ffffffffffffea10,(StuntDouble **)in_stack_ffffffffffffea08
                      );
            std::
            vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
            ::push_back((vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                         *)in_stack_ffffffffffffea10,(value_type *)in_stack_ffffffffffffea08);
          }
        }
        local_18 = SelectionManager::nextSelected
                             ((SelectionManager *)in_stack_ffffffffffffea20._M_current,
                              (int *)in_stack_ffffffffffffea18._M_current);
      }
      std::
      vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
      ::begin((vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
               *)in_stack_ffffffffffffea08);
      std::
      vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
      ::end((vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
             *)in_stack_ffffffffffffea08);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<double,OpenMD::StuntDouble*>*,std::vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>>>
                (in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
      sVar10 = std::
               vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
               ::size(&local_f0);
      if (sVar10 < 5) {
        sVar10 = std::
                 vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                 ::size(&local_f0);
        local_15a0 = (int)sVar10;
      }
      else {
        local_15a0 = 4;
      }
      iVar7 = (int)((double)(local_15a0 * (local_15a0 + -1)) * 0.5);
      StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea18._M_current);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffea10,
                 (Vector3<double> *)in_stack_ffffffffffffea08);
      for (local_147c = 0; local_147c < local_15a0 + -1; local_147c = local_147c + 1) {
        pvVar11 = std::
                  vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                  ::operator[](&local_f0,(long)local_147c);
        local_20 = pvVar11->second;
        StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea18._M_current);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_ffffffffffffea10,
                   (Vector3<double> *)in_stack_ffffffffffffea08);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffea18._M_current,
                          (Vector<double,_3U> *)in_stack_ffffffffffffea10);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_ffffffffffffea18._M_current,
                   (Vector<double,_3U> *)in_stack_ffffffffffffea10);
        if (bVar4) {
          Snapshot::wrapVector
                    ((Snapshot *)CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90),
                     in_stack_ffffffffffffea88);
        }
        Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffea10);
        local_14b4 = local_147c;
        while (local_14b4 = local_14b4 + 1, local_14b4 < local_15a0) {
          pvVar11 = std::
                    vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                    ::operator[](&local_f0,(long)local_14b4);
          local_28 = pvVar11->second;
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea18._M_current);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffea10,
                     (Vector3<double> *)in_stack_ffffffffffffea08);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffea18._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffea10);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffea18._M_current,
                     (Vector<double,_3U> *)in_stack_ffffffffffffea10);
          if (bVar4) {
            Snapshot::wrapVector
                      ((Snapshot *)CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90),
                       in_stack_ffffffffffffea88);
          }
          Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffea10);
          local_d0 = dot<double,3u>((Vector<double,_3U> *)in_stack_ffffffffffffea20._M_current,
                                    (Vector<double,_3U> *)in_stack_ffffffffffffea18._M_current);
          _Var14 = std::pow<double,int>
                             ((double)in_stack_ffffffffffffea10,
                              (int)((ulong)in_stack_ffffffffffffea08 >> 0x20));
          local_d8 = (DumpReader *)((double)local_d8 - (_Var14 * 2.25) / (double)iVar7);
        }
      }
      if (0 < iVar7) {
        if (bVar4) {
          Snapshot::wrapVector
                    ((Snapshot *)CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90),
                     in_stack_ffffffffffffea88);
        }
        uVar3 = *(uint *)(in_RDI + 0x34);
        in_stack_ffffffffffffea48 =
             (SelectionEvaluator *)
             Vector<double,_3U>::operator[](local_90,*(uint *)(in_RDI + 0xdb0));
        dVar2 = *(double *)&(in_stack_ffffffffffffea48->compiler).filename;
        pdVar9 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)&stack0xffffffffffffec48,
                            *(uint *)(in_RDI + 0xdb0),*(uint *)(in_RDI + 0xdb0));
        iVar7 = (int)(((double)uVar3 * (dVar1 * 0.5 + dVar2)) / *pdVar9);
        in_stack_ffffffffffffea10 = local_d8;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd68),(long)iVar7
                            );
        *pvVar12 = (double)in_stack_ffffffffffffea10 + *pvVar12;
        in_stack_ffffffffffffea18._M_current = (pair<double,_OpenMD::StuntDouble_*> *)local_d8;
        in_stack_ffffffffffffea20._M_current = (pair<double,_OpenMD::StuntDouble_*> *)local_d8;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd80),(long)iVar7
                            );
        *pvVar12 = (double)in_stack_ffffffffffffea18._M_current *
                   (double)in_stack_ffffffffffffea20._M_current + *pvVar12;
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd98),(long)iVar7);
        *pvVar13 = *pvVar13 + 1;
      }
      in_stack_ffffffffffffea08 =
           (Snapshot *)
           SelectionManager::nextSelected
                     ((SelectionManager *)in_stack_ffffffffffffea20._M_current,
                      (int *)in_stack_ffffffffffffea18._M_current);
      local_10 = in_stack_ffffffffffffea08;
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1e4aae);
  }
  writeQz(in_stack_ffffffffffffed40);
  DumpReader::~DumpReader(in_stack_ffffffffffffea10);
  std::
  vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  ::~vector((vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
             *)in_stack_ffffffffffffea20._M_current);
  return;
}

Assistant:

void TetrahedralityParamZ::process() {
    StuntDouble* sd;
    StuntDouble* sd2;
    StuntDouble* sdi;
    StuntDouble* sdj;
    int myIndex;
    Vector3d vec;
    Vector3d ri, rj, rk, rik, rkj;
    RealType r;
    RealType cospsi;
    RealType Qk;
    std::vector<std::pair<RealType, StuntDouble*>> myNeighbors;
    int isd1;
    int isd2;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Mat3x3d hmat = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      // outer loop is over the selected StuntDoubles:
      for (sd = seleMan1_.beginSelected(isd1); sd != NULL;
           sd = seleMan1_.nextSelected(isd1)) {
        myIndex = sd->getGlobalIndex();

        Qk = 1.0;
        myNeighbors.clear();

        for (sd2 = seleMan2_.beginSelected(isd2); sd2 != NULL;
             sd2 = seleMan2_.nextSelected(isd2)) {
          if (sd2->getGlobalIndex() != myIndex) {
            vec = sd->getPos() - sd2->getPos();

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            r = vec.length();

            // Check to see if neighbor is in bond cutoff

            if (r < rCut_) { myNeighbors.push_back(std::make_pair(r, sd2)); }
          }
        }

        // Sort the vector using predicate and std::sort
        std::sort(myNeighbors.begin(), myNeighbors.end());

        // Use only the 4 closest neighbors to do the rest of the work:

        int nbors = myNeighbors.size() > 4 ? 4 : myNeighbors.size();
        int nang  = int(0.5 * (nbors * (nbors - 1)));

        rk = sd->getPos();

        for (int i = 0; i < nbors - 1; i++) {
          sdi = myNeighbors[i].second;
          ri  = sdi->getPos();
          rik = rk - ri;
          if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(rik);

          rik.normalize();

          for (int j = i + 1; j < nbors; j++) {
            sdj = myNeighbors[j].second;
            rj  = sdj->getPos();
            rkj = rk - rj;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rkj);
            rkj.normalize();

            cospsi = dot(rik, rkj);

            // Calculates scaled Qk for each molecule using calculated
            // angles from 4 or fewer nearest neighbors.
            Qk -= (pow(cospsi + 1.0 / 3.0, 2) * 2.25 / nang);
          }
        }

        if (nang > 0) {
          if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(rk);

          int binNo =
              int(nBins_ * (halfBoxZ_ + rk[axis_]) / hmat(axis_, axis_));
          sliceQ_[binNo] += Qk;
          sliceQ2_[binNo] += Qk * Qk;
          sliceCount_[binNo] += 1;
        }
      }
    }
    writeQz();
  }